

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O0

lines_t * __thiscall
backward::SourceFile::get_lines(SourceFile *this,uint line_start,uint line_count,lines_t *lines)

{
  basic_ifstream<char,_std::char_traits<char>_> *pbVar1;
  byte bVar2;
  bool bVar3;
  basic_ifstream<char,_std::char_traits<char>_> **ppbVar4;
  ref_t ptVar5;
  iterator_type this_00;
  pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RCX;
  int in_EDX;
  uint in_ESI;
  handle<std::basic_ifstream<char,_std::char_traits<char>_>_*,_backward::details::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_*>_>
  *in_RDI;
  bool started;
  uint line_idx;
  string line;
  value_type *in_stack_fffffffffffffe78;
  fpos<__mbstate_t> *in_stack_fffffffffffffe80;
  uint *in_stack_fffffffffffffe88;
  pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_02;
  const_iterator in_stack_fffffffffffffea0;
  const_iterator in_stack_fffffffffffffea8;
  vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e8;
  pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_d0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_80;
  char *local_78;
  byte local_69;
  undefined4 local_68;
  uint local_54;
  pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  undefined8 local_28;
  pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  int local_18;
  uint local_14;
  pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_8;
  
  local_20 = in_RCX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  ppbVar4 = details::
            handle<std::basic_ifstream<char,_std::char_traits<char>_>_*,_backward::details::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_*>_>
            ::operator->(in_RDI);
  std::ios::clear(*ppbVar4 + *(long *)(*(long *)*ppbVar4 + -0x18),0);
  ppbVar4 = details::
            handle<std::basic_ifstream<char,_std::char_traits<char>_>_*,_backward::details::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_*>_>
            ::operator->(in_RDI);
  pbVar1 = *ppbVar4;
  std::fpos<__mbstate_t>::fpos(in_stack_fffffffffffffe80,(streamoff)in_stack_fffffffffffffe78);
  std::istream::seekg(pbVar1,local_50._32_8_,local_28);
  std::__cxx11::string::string((string *)&local_50);
  for (local_54 = 1; local_54 < local_14; local_54 = local_54 + 1) {
    ptVar5 = details::
             handle<std::basic_ifstream<char,_std::char_traits<char>_>_*,_backward::details::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_*>_>
             ::operator*(in_RDI);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)ptVar5,(string *)&local_50);
    ptVar5 = details::
             handle<std::basic_ifstream<char,_std::char_traits<char>_>_*,_backward::details::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_*>_>
             ::operator*(in_RDI);
    bVar2 = std::ios::operator!((ios *)(ptVar5 + *(long *)(*(long *)ptVar5 + -0x18)));
    if ((bVar2 & 1) != 0) {
      local_8 = local_20;
      goto LAB_0012462a;
    }
  }
  local_69 = 0;
  do {
    if (local_14 + local_18 <= local_54) {
      this_01 = local_20;
      std::
      vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::rbegin((vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_20);
      this_02 = &local_e8;
      std::
      vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::rend((vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)this_01);
      std::
      find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,std::__cxx11::string>*,std::vector<std::pair<unsigned_int,std::__cxx11::string>,std::allocator<std::pair<unsigned_int,std::__cxx11::string>>>>>,backward::SourceFile::not_isempty>
                (&local_e8.
                  super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 &local_e8.
                  super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,this_02);
      this_00 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::base((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        *)&local_e8.
                           super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_d0 = this_00._M_current;
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned_int,std::__cxx11::string>const*,std::vector<std::pair<unsigned_int,std::__cxx11::string>,std::allocator<std::pair<unsigned_int,std::__cxx11::string>>>>
      ::__normal_iterator<std::pair<unsigned_int,std::__cxx11::string>*>
                ((__normal_iterator<const_std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)this_00._M_current,
                 (__normal_iterator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffffe78);
      std::
      vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::end((vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)in_stack_fffffffffffffe78);
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned_int,std::__cxx11::string>const*,std::vector<std::pair<unsigned_int,std::__cxx11::string>,std::allocator<std::pair<unsigned_int,std::__cxx11::string>>>>
      ::__normal_iterator<std::pair<unsigned_int,std::__cxx11::string>*>
                ((__normal_iterator<const_std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)this_00._M_current,
                 (__normal_iterator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffffe78);
      std::
      vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::erase(this_02,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      local_8 = local_20;
LAB_0012462a:
      local_68 = 1;
      std::__cxx11::string::~string((string *)&local_50);
      return (lines_t *)local_8;
    }
    ptVar5 = details::
             handle<std::basic_ifstream<char,_std::char_traits<char>_>_*,_backward::details::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_*>_>
             ::operator*(in_RDI);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)ptVar5,(string *)&local_50);
    ptVar5 = details::
             handle<std::basic_ifstream<char,_std::char_traits<char>_>_*,_backward::details::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_*>_>
             ::operator*(in_RDI);
    bVar2 = std::ios::operator!((ios *)(ptVar5 + *(long *)(*(long *)ptVar5 + -0x18)));
    if ((bVar2 & 1) != 0) {
      local_8 = local_20;
      goto LAB_0012462a;
    }
    if ((local_69 & 1) == 0) {
      in_stack_fffffffffffffea8._M_current = &local_50;
      local_80 = std::__cxx11::string::begin();
      local_88 = std::__cxx11::string::end();
      local_78 = (char *)std::
                         find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,backward::SourceFile::not_isspace>
                                   (local_80,local_88);
      local_98 = std::__cxx11::string::end();
      bVar3 = __gnu_cxx::operator==
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffe80,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffe78);
      if (!bVar3) {
        local_69 = 1;
        goto LAB_001244a8;
      }
    }
    else {
LAB_001244a8:
      in_stack_fffffffffffffea0._M_current = local_20;
      std::make_pair<unsigned_int&,std::__cxx11::string&>
                (in_stack_fffffffffffffe88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe80);
      std::
      vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back((vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      std::
      pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x1244f5);
    }
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

lines_t &get_lines(unsigned line_start, unsigned line_count, lines_t &lines) {
    using namespace std;
    // This function make uses of the dumbest algo ever:
    //	1) seek(0)
    //	2) read lines one by one and discard until line_start
    //	3) read line one by one until line_start + line_count
    //
    // If you are getting snippets many time from the same file, it is
    // somewhat a waste of CPU, feel free to benchmark and propose a
    // better solution ;)

    _file->clear();
    _file->seekg(0);
    string line;
    unsigned line_idx;

    for (line_idx = 1; line_idx < line_start; ++line_idx) {
      std::getline(*_file, line);
      if (!*_file) {
        return lines;
      }
    }

    // think of it like a lambda in C++98 ;)
    // but look, I will reuse it two times!
    // What a good boy am I.
    struct isspace {
      bool operator()(char c) { return std::isspace(c); }
    };

    bool started = false;
    for (; line_idx < line_start + line_count; ++line_idx) {
      getline(*_file, line);
      if (!*_file) {
        return lines;
      }
      if (!started) {
        if (std::find_if(line.begin(), line.end(), not_isspace()) == line.end())
          continue;
        started = true;
      }
      lines.push_back(make_pair(line_idx, line));
    }

    lines.erase(
        std::find_if(lines.rbegin(), lines.rend(), not_isempty()).base(),
        lines.end());
    return lines;
  }